

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghsymbol.cc
# Opt level: O1

void __thiscall Constructor::printBody(Constructor *this,ostream *s,ParserWalker *walker)

{
  int iVar1;
  TripleSymbol *pTVar2;
  ConstructState *pCVar3;
  char *pcVar4;
  OperandSymbol *pOVar5;
  long lVar6;
  pointer pbVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  bool bVar11;
  
  iVar8 = this->flowthruindex;
  lVar9 = (long)iVar8;
  if (lVar9 == -1) {
    iVar8 = this->firstwhitespace;
    if (iVar8 == -1) {
      return;
    }
  }
  else {
    pTVar2 = (this->operands).super__Vector_base<OperandSymbol_*,_std::allocator<OperandSymbol_*>_>.
             _M_impl.super__Vector_impl_data._M_start[lVar9]->triple;
    if (pTVar2 == (TripleSymbol *)0x0) {
      bVar11 = true;
    }
    else {
      lVar6 = __dynamic_cast(pTVar2,&TripleSymbol::typeinfo,&SubtableSymbol::typeinfo,0);
      bVar11 = lVar6 == 0;
    }
    if (!bVar11) {
      iVar1 = walker->depth;
      walker->depth = iVar1 + 1;
      walker->breadcrumb[iVar1] = iVar8 + 1;
      pCVar3 = (walker->point->resolve).
               super__Vector_base<ConstructState_*,_std::allocator<ConstructState_*>_>._M_impl.
               super__Vector_impl_data._M_start[lVar9];
      walker->point = pCVar3;
      walker->breadcrumb[walker->depth] = 0;
      printBody(pCVar3->ct,s,walker);
      walker->point = walker->point->parent;
      walker->depth = walker->depth + -1;
    }
    iVar8 = this->firstwhitespace;
    if (!(bool)(bVar11 & iVar8 != -1)) {
      return;
    }
  }
  uVar10 = (ulong)(iVar8 + 1);
  pbVar7 = (this->printpiece).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (uVar10 < (ulong)((long)(this->printpiece).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar7 >> 5)) {
    lVar9 = (long)iVar8 * 0x20 + 0x28;
    do {
      pcVar4 = *(char **)((long)pbVar7 + lVar9 + -8);
      if (*pcVar4 == '\n') {
        pOVar5 = (this->operands).
                 super__Vector_base<OperandSymbol_*,_std::allocator<OperandSymbol_*>_>._M_impl.
                 super__Vector_impl_data._M_start[(long)pcVar4[1] + -0x41];
        (**(code **)(*(long *)&(pOVar5->super_SpecificSymbol).super_TripleSymbol.super_SleighSymbol
                    + 0x50))(pOVar5,s,walker);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  (s,pcVar4,*(long *)((long)&(pbVar7->_M_dataplus)._M_p + lVar9));
      }
      uVar10 = uVar10 + 1;
      pbVar7 = (this->printpiece).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar9 = lVar9 + 0x20;
    } while (uVar10 < (ulong)((long)(this->printpiece).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar7 >> 5))
    ;
  }
  return;
}

Assistant:

void Constructor::printBody(ostream &s,ParserWalker &walker) const

{
  if (flowthruindex != -1) {
    SubtableSymbol *sym = dynamic_cast<SubtableSymbol *>(operands[flowthruindex]->getDefiningSymbol());
    if (sym != (SubtableSymbol *)0) {
      walker.pushOperand(flowthruindex);
      walker.getConstructor()->printBody(s,walker);
      walker.popOperand();
      return;
    }
  }
  if (firstwhitespace == -1) return; // Nothing to print after firstwhitespace
  for(int4 i=firstwhitespace+1;i<printpiece.size();++i) {
    if (printpiece[i][0]=='\n') {
      int4 index = printpiece[i][1]-'A';
      operands[index]->print(s,walker);
    }
    else
      s << printpiece[i];
  }
}